

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.cpp
# Opt level: O3

void __thiscall
asmjit::ZoneStackBase::_cleanupBlock(ZoneStackBase *this,uint32_t side,size_t middleIndex)

{
  ulong *puVar1;
  Block *pBVar2;
  ZoneAllocator *pZVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  sbyte sVar6;
  Error EVar7;
  uint uVar8;
  CodeHolder *__dest;
  CodeHolder *pCVar9;
  CodeHolder *extraout_RAX;
  CodeHolder *pCVar10;
  sbyte sVar11;
  ulong uVar12;
  uint extraout_EDX;
  uint sizeOfT;
  uint extraout_EDX_00;
  void *pvVar13;
  long *extraout_RDX;
  long lVar14;
  uint uVar15;
  uint uVar16;
  CodeHolder *unaff_RBX;
  long *plVar17;
  ulong uVar18;
  uint uVar19;
  undefined4 in_register_00000034;
  CodeHolder *pCVar21;
  CodeHolder *allocator;
  CodeHolder *pCVar22;
  long lVar23;
  ulong uVar24;
  CodeHolder *pCVar25;
  CodeHolder *unaff_R13;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uint uStack_124;
  ulong uStack_120;
  CodeHolder *pCStack_118;
  CodeHolder *pCStack_110;
  ulong uStack_108;
  long *plStack_100;
  CodeHolder *pCStack_f8;
  ulong uStack_f0;
  CodeHolder *pCStack_e8;
  CodeHolder *pCStack_e0;
  ulong uStack_d8;
  CodeHolder *pCStack_c8;
  CodeHolder *pCStack_c0;
  long *plStack_b8;
  ulong uStack_b0;
  ulong uStack_a8;
  ulong uStack_a0;
  CodeHolder *pCStack_98;
  CodeHolder *pCStack_90;
  ulong uStack_88;
  code *pcStack_80;
  CodeHolder *pCStack_70;
  CodeHolder *pCStack_68;
  CodeHolder *pCStack_60;
  ulong uStack_58;
  CodeHolder *pCStack_48;
  ulong uStack_40;
  ulong uVar20;
  
  pCVar21 = (CodeHolder *)CONCAT44(in_register_00000034,side);
  uVar24 = (ulong)side;
  pBVar2 = this->_block[uVar24];
  __dest = (CodeHolder *)pBVar2->_start;
  if (__dest == (CodeHolder *)pBVar2->_end) {
    __dest = (CodeHolder *)(ulong)(side == 0);
    pCVar21 = (CodeHolder *)pBVar2->_link[(long)__dest];
    if (pCVar21 == (CodeHolder *)0x0) {
      if (this->_block[(long)__dest] == pBVar2) {
        pvVar13 = (void *)((long)pBVar2->_link + middleIndex);
        pBVar2->_start = pvVar13;
        pBVar2->_end = pvVar13;
      }
      return;
    }
    if (*(Block **)((long)&pCVar21->_allocator + uVar24 * 8 + 0xffffffffffffffc0) != pBVar2)
    goto LAB_001234d4;
    pZVar3 = this->_allocator;
    if (pZVar3->_zone != (Zone *)0x0) {
      pBVar2->_link[0] = (Block *)pZVar3->_slots[9];
      pZVar3->_slots[9] = (Slot *)pBVar2;
      *(undefined8 *)((long)&pCVar21->_allocator + uVar24 * 8 + 0xffffffffffffffc0) = 0;
      this->_block[uVar24] = (Block *)pCVar21;
      return;
    }
  }
  else {
    _cleanupBlock();
LAB_001234d4:
    _cleanupBlock();
  }
  _cleanupBlock();
  uVar8 = *(uint *)((long)&((CodeHolder *)this)->_baseAddress + 4);
  uVar24 = (ulong)uVar8;
  uVar16 = 0;
  if (side <= uVar8) {
    return;
  }
  pCVar25 = (CodeHolder *)(ulong)extraout_EDX;
  if (side * extraout_EDX < side) {
    return;
  }
  if (*(long *)&pCVar21->_environment == 0) {
    uStack_58 = 0x12361c;
    allocator = pCVar21;
    ZoneVectorBase::_reserve();
    pCVar22 = (CodeHolder *)this;
LAB_0012361c:
    uStack_58 = 0x123621;
    ZoneVectorBase::_reserve();
LAB_00123621:
    uStack_58 = 0x123626;
    ZoneVectorBase::_reserve();
  }
  else {
    uStack_58 = 0x12352e;
    uVar16 = 0;
    __dest = (CodeHolder *)
             ZoneAllocator::_alloc((ZoneAllocator *)pCVar21,(ulong)(side * extraout_EDX),&uStack_40)
    ;
    if (__dest == (CodeHolder *)0x0) {
      return;
    }
    allocator = *(CodeHolder **)&((CodeHolder *)this)->_environment;
    pCVar22 = pCVar25;
    if ((ulong)*(uint *)&((CodeHolder *)this)->_baseAddress != 0) {
      uStack_58 = 0x12355f;
      pCStack_48 = pCVar25;
      memcpy(__dest,allocator,(ulong)*(uint *)&((CodeHolder *)this)->_baseAddress * (long)pCVar25);
      pCVar22 = pCStack_48;
      unaff_R13 = allocator;
      pCVar25 = __dest;
    }
    unaff_RBX = (CodeHolder *)this;
    if (allocator == (CodeHolder *)0x0) {
LAB_001235e9:
      uVar16 = 0;
      uVar8 = (uint)(uStack_40 / (ulong)pCVar22);
      *(uint *)((long)&((CodeHolder *)this)->_baseAddress + 4) = uVar8;
      if (side <= uVar8) {
        ((CodeHolder *)this)->_environment = (Environment)__dest;
        return;
      }
      goto LAB_0012361c;
    }
    if (*(long *)&pCVar21->_environment == 0) goto LAB_00123621;
    uVar24 = uVar24 * (long)pCVar22;
    if (uVar24 != 0) {
      if (uVar24 < 0x201) {
        if (uVar24 < 0x81) {
          uVar24 = uVar24 + 0x1fffffffff >> 5;
        }
        else {
          uVar24 = (uVar24 + 0x3fffffff7f >> 6) + 4;
        }
        allocator->_environment =
             (Environment)
             *(undefined8 *)
              ((long)&pCVar21->_allocator + (uVar24 & 0xffffffff) * 8 + 0xffffffffffffffc8);
        *(CodeHolder **)
         ((long)&pCVar21->_allocator + (uVar24 & 0xffffffff) * 8 + 0xffffffffffffffc8) = allocator;
      }
      else {
        uStack_58 = 0x1235bc;
        ZoneAllocator::_releaseDynamic((ZoneAllocator *)pCVar21,allocator,uVar24);
        unaff_R13 = pCVar22;
        pCVar25 = __dest;
      }
      goto LAB_001235e9;
    }
  }
  uStack_58 = 0x12362b;
  ZoneVectorBase::_reserve();
  uVar18 = (ulong)sizeOfT;
  uVar8 = *(uint *)&pCVar22->_baseAddress;
  uStack_88 = (ulong)uVar8;
  pCStack_70 = unaff_RBX;
  pCStack_68 = pCVar21;
  pCStack_60 = pCVar25;
  uStack_58 = (ulong)side;
  if (uVar16 <= *(uint *)((long)&pCVar22->_baseAddress + 4)) {
LAB_00123643:
    if (uVar8 < uVar16) {
      pcStack_80 = (code *)0x123664;
      memset((void *)(*(long *)&pCVar22->_environment + uStack_88 * uVar18),0,
             (uVar16 - uVar8) * uVar18);
    }
    *(uint *)&pCVar22->_baseAddress = uVar16;
    return;
  }
  pcStack_80 = (code *)0x123684;
  pCVar21 = pCVar22;
  EVar7 = ZoneVectorBase::_grow
                    ((ZoneVectorBase *)pCVar22,(ZoneAllocator *)allocator,sizeOfT,uVar16 - uVar8);
  uVar12 = (ulong)EVar7;
  if (EVar7 != 0) {
    return;
  }
  if (uVar16 <= *(uint *)((long)&pCVar22->_baseAddress + 4)) goto LAB_00123643;
  pcStack_80 = ZoneBitVector::copyFrom;
  ZoneVectorBase::_resize();
  uVar8 = *(uint *)(extraout_RDX + 1);
  pCVar25 = (CodeHolder *)(ulong)uVar8;
  if (uVar8 == 0) {
    *(undefined4 *)&pCVar21->_baseAddress = 0;
    return;
  }
  pCVar10 = *(CodeHolder **)&pCVar21->_environment;
  uVar19 = uVar8 + 0x3f;
  uVar20 = (ulong)uVar19;
  plStack_b8 = extraout_RDX;
  pCVar9 = pCVar10;
  if (uVar8 <= *(uint *)((long)&pCVar21->_baseAddress + 4)) goto LAB_0012373a;
  uVar15 = uVar19 & 0xffffffc0;
  if (uVar15 < uVar8) {
    return;
  }
  uStack_a8 = (ulong)uVar16;
  uStack_a0 = uVar24;
  pCStack_98 = unaff_R13;
  pCStack_90 = pCVar22;
  pcStack_80 = (code *)uVar18;
  if (*(long *)&allocator->_environment == 0) {
    uStack_d8 = 0x1237ad;
    allocator = pCVar21;
    ZoneBitVector::copyFrom();
    pCVar9 = extraout_RAX;
LAB_001237ad:
    uVar24 = (ulong)uVar15;
  }
  else {
    uStack_d8 = 0x123706;
    pCStack_c0 = allocator;
    pCVar9 = (CodeHolder *)
             ZoneAllocator::_alloc((ZoneAllocator *)allocator,(ulong)(uVar15 >> 3),&uStack_b0);
    if (pCVar9 == (CodeHolder *)0x0) {
      return;
    }
    uVar24 = uStack_b0 * 8;
    uVar12 = uStack_b0;
    if (uVar24 < uStack_b0) goto LAB_001237ad;
  }
  uVar16 = (uint)uVar12;
  if (pCVar10 == (CodeHolder *)0x0) {
LAB_00123730:
    pCVar21->_environment = (Environment)pCVar9;
    *(int *)((long)&pCVar21->_baseAddress + 4) = (int)uVar24;
LAB_0012373a:
    *(uint *)&pCVar21->_baseAddress = uVar8;
    if (0x3f < uVar19) {
      lVar14 = *plStack_b8;
      uVar24 = 0;
      do {
        *(undefined8 *)((long)&pCVar9->_allocator + uVar24 * 8 + 0xffffffffffffffc0) =
             *(undefined8 *)(lVar14 + uVar24 * 8);
        uVar24 = uVar24 + 1;
      } while (uVar19 >> 6 != uVar24);
    }
    return;
  }
  pCVar22 = pCStack_c0;
  if (*(long *)&pCStack_c0->_environment == 0) {
    uStack_d8 = 0x1237ba;
    ZoneBitVector::copyFrom();
  }
  else {
    uVar15 = *(uint *)((long)&pCVar21->_baseAddress + 4);
    allocator = (CodeHolder *)(ulong)uVar15;
    pCStack_c8 = pCVar9;
    if (7 < uVar15) {
      uStack_d8 = 0x1237a1;
      ZoneBitVector::copyFrom();
      pCVar9 = pCStack_c8;
      goto LAB_00123730;
    }
  }
  uStack_d8 = 0x1237bf;
  ZoneBitVector::copyFrom();
  plStack_100 = plStack_b8;
  pCStack_f8 = pCVar25;
  uStack_f0 = uVar24;
  pCStack_e8 = pCVar10;
  pCStack_e0 = pCVar21;
  uStack_d8 = uVar20;
  if (uVar16 < extraout_EDX_00) {
    ZoneBitVector::_resize();
    plVar17 = plStack_b8;
    pCVar9 = pCVar22;
    allocator = pCVar25;
LAB_00123a64:
    ZoneBitVector::_resize();
LAB_00123a69:
    uVar18 = (ulong)uVar19;
LAB_00123866:
    uVar8 = (int)plVar17 + 0x3f;
    if (0x3f < uVar8) {
      uVar24 = 0;
      do {
        *(long *)((long)&pCVar10->_allocator + uVar24 * 8 + 0xffffffffffffffc0) =
             *(long *)((long)&pCVar21->_allocator + uVar24 * 8 + 0xffffffffffffffc0);
        uVar24 = uVar24 + 1;
      } while (uVar8 >> 6 != uVar24);
LAB_0012389f:
      if (*(long *)&pCStack_118->_environment == 0) {
        ZoneBitVector::_resize();
      }
      else {
        uVar8 = *(uint *)((long)&allocator->_baseAddress + 4);
        if (7 < uVar8) {
          uVar24 = (ulong)(uVar8 >> 3);
          if (uVar8 < 0x1008) {
            if (uVar8 < 0x408) {
              uVar24 = uVar24 + 0x1fffffffff >> 5;
            }
            else {
              uVar24 = (uVar24 + 0x3fffffff7f >> 6) + 4;
            }
            pCVar21->_environment =
                 (Environment)
                 *(long *)((long)&pCStack_118->_allocator +
                          (uVar24 & 0xffffffff) * 8 + 0xffffffffffffffc8);
            *(CodeHolder **)
             ((long)&pCStack_118->_allocator + (uVar24 & 0xffffffff) * 8 + 0xffffffffffffffc8) =
                 pCVar21;
          }
          else {
            ZoneAllocator::_releaseDynamic((ZoneAllocator *)pCStack_118,pCVar21,uVar24);
          }
          goto LAB_00123910;
        }
      }
      ZoneBitVector::_resize();
      goto LAB_00123a7b;
    }
    if (pCVar21 != (CodeHolder *)0x0) goto LAB_0012389f;
LAB_00123910:
    allocator->_environment = (Environment)pCVar10;
    *(int *)((long)&allocator->_baseAddress + 4) = (int)uVar18;
    __dest = (CodeHolder *)(ulong)uStack_124;
    pCVar9 = pCStack_110;
    uVar24 = uStack_120;
    pCVar21 = pCVar10;
  }
  else {
    uVar24 = (ulong)extraout_EDX_00;
    pCStack_110 = (CodeHolder *)&allocator->_baseAddress;
    plVar17 = (long *)(ulong)*(uint *)&allocator->_baseAddress;
    if (extraout_EDX_00 <= *(uint *)&allocator->_baseAddress) {
      ZoneBitVector::_resize();
      return;
    }
    pCVar21 = *(CodeHolder **)&allocator->_environment;
    pCVar9 = pCStack_110;
    if (*(uint *)((long)&allocator->_baseAddress + 4) < extraout_EDX_00) {
      uStack_124 = (uint)__dest;
      uVar19 = uVar16 + 0x3f & 0xffffffc0;
      if (uVar19 < extraout_EDX_00) {
        return;
      }
      if (*(long *)&pCVar22->_environment == 0) goto LAB_00123a64;
      pCVar9 = (CodeHolder *)(ulong)(uVar19 >> 3);
      pCVar10 = (CodeHolder *)
                ZoneAllocator::_alloc((ZoneAllocator *)pCVar22,(size_t)pCVar9,&uStack_108);
      if (pCVar10 == (CodeHolder *)0x0) {
        return;
      }
      uVar18 = uStack_108 * 8;
      uStack_120 = uVar24;
      pCStack_118 = pCVar22;
      if (uVar18 < uStack_108) goto LAB_00123a69;
      goto LAB_00123866;
    }
  }
  pCStack_118 = (CodeHolder *)((ulong)plVar17 >> 6 & 0x3ffffff);
  uVar8 = (uint)pCStack_118;
  uVar19 = (uint)uVar24;
  sVar6 = (sbyte)(uVar19 & 0x3f);
  lVar14 = -((ulong)__dest & 0xff);
  uVar16 = (uint)plVar17 & 0x3f;
  if (((ulong)plVar17 & 0x3f) != 0) {
    sVar11 = 0;
    if ((uVar8 == ((uint)(uVar24 >> 6) & 0x3ffffff)) && (sVar11 = sVar6, (uVar19 & 0x3f) <= uVar16))
    {
LAB_00123a7b:
      ZoneBitVector::_resize();
      BaseAssembler::BaseAssembler((BaseAssembler *)pCStack_118);
      pCStack_118->_environment = (Environment)&PTR__Assembler_00154928;
      if (pCVar9 != (CodeHolder *)0x0) {
        CodeHolder::attach(pCVar9,(BaseEmitter *)pCStack_118);
        return;
      }
      return;
    }
    puVar1 = (ulong *)((long)&pCVar21->_allocator + (long)pCStack_118 * 8 + 0xffffffffffffffc0U);
    *puVar1 = *puVar1 | lVar14 << (sVar11 - (char)uVar16 & 0x3fU);
    uVar8 = uVar8 + 1;
  }
  auVar5 = _DAT_00137910;
  auVar4 = _DAT_00137900;
  uVar16 = uVar19 + 0x3f >> 6;
  if (uVar8 < uVar16) {
    uVar12 = (ulong)uVar8;
    lVar23 = (uVar16 - uVar12) + -1;
    auVar26._8_4_ = (int)lVar23;
    auVar26._0_8_ = lVar23;
    auVar26._12_4_ = (int)((ulong)lVar23 >> 0x20);
    uVar18 = 0;
    auVar26 = auVar26 ^ _DAT_00137910;
    do {
      auVar27._8_4_ = (int)uVar18;
      auVar27._0_8_ = uVar18;
      auVar27._12_4_ = (int)(uVar18 >> 0x20);
      auVar27 = (auVar27 | auVar4) ^ auVar5;
      if ((bool)(~(auVar27._4_4_ == auVar26._4_4_ && auVar26._0_4_ < auVar27._0_4_ ||
                  auVar26._4_4_ < auVar27._4_4_) & 1)) {
        *(long *)((long)&pCVar21->_allocator + uVar18 * 8 + uVar12 * 8 + 0xffffffffffffffc0) =
             lVar14;
      }
      if ((auVar27._12_4_ != auVar26._12_4_ || auVar27._8_4_ <= auVar26._8_4_) &&
          auVar27._12_4_ <= auVar26._12_4_) {
        *(long *)((long)&pCVar21->_allocator + uVar18 * 8 + uVar12 * 8 + 0xffffffffffffffc8) =
             lVar14;
      }
      uVar18 = uVar18 + 2;
    } while (((uVar16 - uVar12) + 1 & 0xfffffffffffffffe) != uVar18);
  }
  if ((uVar24 & 0x3f) != 0) {
    uVar24 = 0;
    if ((char)__dest != '\0') {
      uVar24 = ~(-1L << sVar6);
    }
    *(ulong *)((long)&pCVar21->_allocator + (ulong)(uVar16 - 1) * 8 + 0xffffffffffffffc0) = uVar24;
  }
  *(uint *)&pCVar9->_environment = uVar19;
  return;
}

Assistant:

void ZoneStackBase::_cleanupBlock(uint32_t side, size_t middleIndex) noexcept {
  Block* block = _block[side];
  ASMJIT_ASSERT(block->empty());

  Block* prev = block->_link[!side];
  if (prev) {
    ASMJIT_ASSERT(prev->_link[side] == block);
    _allocator->release(block, kBlockSize);

    prev->_link[side] = nullptr;
    _block[side] = prev;
  }
  else if (_block[!side] == block) {
    // If the container becomes empty center both pointers in the remaining block.
    block->_start = (uint8_t*)block + middleIndex;
    block->_end = (uint8_t*)block + middleIndex;
  }
}